

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::HLSL2GLSLConverterImpl(HLSL2GLSLConverterImpl *this)

{
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var1;
  HLSL2GLSLConverterImpl *pHVar2;
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *this_00;
  _Hashtable<Diligent::HashMapStringKey,Diligent::HashMapStringKey,std::allocator<Diligent::HashMapStringKey>,std::__detail::_Identity,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  allocator local_3b2;
  allocator local_3b1;
  HLSL2GLSLConverterImpl *local_3b0;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_3a8;
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_3a0;
  HLSLTokenizer *local_398;
  String Dim;
  FunctionStubHashKey local_370;
  GLSLStubInfo local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> GLSLSampler;
  char *Attrib;
  size_type sStack_2d8;
  char *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  String local_270;
  String local_250;
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_230;
  _Hashtable<Diligent::HashMapStringKey,Diligent::HashMapStringKey,std::allocator<Diligent::HashMapStringKey>,std::__detail::_Identity,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_228;
  long local_220;
  String Dimensions [7];
  String Prefixes [4];
  String Suffixes [4];
  
  (this->m_GLSLStubs)._M_h._M_buckets = &(this->m_GLSLStubs)._M_h._M_single_bucket;
  (this->m_GLSLStubs)._M_h._M_bucket_count = 1;
  (this->m_GLSLStubs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_GLSLStubs)._M_h._M_element_count = 0;
  (this->m_GLSLStubs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_GLSLStubs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_GLSLStubs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Parsing::HLSLTokenizer::HLSLTokenizer(&this->m_HLSLTokenizer);
  local_230 = (_Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
               *)&this->m_ImageTypes;
  (this->m_ImageTypes)._M_h._M_buckets = &(this->m_ImageTypes)._M_h._M_single_bucket;
  (this->m_ImageTypes)._M_h._M_bucket_count = 1;
  (this->m_ImageTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_ImageTypes)._M_h._M_element_count = 0;
  (this->m_ImageTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_ImageTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_ImageTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_AtomicOperations)._M_h._M_buckets = &(this->m_AtomicOperations)._M_h._M_single_bucket;
  (this->m_AtomicOperations)._M_h._M_bucket_count = 1;
  (this->m_AtomicOperations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_AtomicOperations)._M_h._M_element_count = 0;
  (this->m_AtomicOperations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_AtomicOperations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_AtomicOperations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_228 = (_Hashtable<Diligent::HashMapStringKey,Diligent::HashMapStringKey,std::allocator<Diligent::HashMapStringKey>,std::__detail::_Identity,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)&this->m_SpecialShaderAttributes;
  (this->m_SpecialShaderAttributes)._M_h._M_buckets =
       &(this->m_SpecialShaderAttributes)._M_h._M_single_bucket;
  (this->m_SpecialShaderAttributes)._M_h._M_bucket_count = 1;
  (this->m_SpecialShaderAttributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_SpecialShaderAttributes)._M_h._M_element_count = 0;
  (this->m_SpecialShaderAttributes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_SpecialShaderAttributes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_SpecialShaderAttributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  array<std::array<std::unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_2UL>,_6UL>
  ::array(&this->m_HLSLSemanticToGLSLVar);
  std::__cxx11::string::string((string *)Prefixes,"",(allocator *)Dimensions);
  local_3b0 = this;
  local_3a8 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->m_HLSLSemanticToGLSLVar;
  local_3a0 = (_Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
               *)&this->m_AtomicOperations;
  std::__cxx11::string::string((string *)(Prefixes + 1),"u",(allocator *)Suffixes);
  std::__cxx11::string::string((string *)(Prefixes + 2),"i",(allocator *)&Attrib);
  std::__cxx11::string::string((string *)(Prefixes + 3),"",(allocator *)&local_348);
  std::__cxx11::string::string((string *)Suffixes,"",(allocator *)Dimensions);
  local_398 = &this->m_HLSLTokenizer;
  std::__cxx11::string::string((string *)(Suffixes + 1),"",(allocator *)&Attrib);
  std::__cxx11::string::string((string *)(Suffixes + 2),"",(allocator *)&local_348);
  std::__cxx11::string::string((string *)(Suffixes + 3),"Shadow",(allocator *)&local_370);
  lVar6 = 0;
  while (lVar6 != 0x80) {
    local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&Prefixes[0]._M_dataplus._M_p + lVar6);
    std::operator+(&Dim,local_308,"sampler1D");
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&Suffixes[0]._M_dataplus._M_p + lVar6);
    local_220 = lVar6;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,1);
    std::__cxx11::string::string((string *)&local_270,"GetTex1DDimensions_1",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler1D");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
    std::__cxx11::string::string((string *)&local_270,"GetTex1DDimensions_3",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler1DArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,2);
    std::__cxx11::string::string((string *)&local_270,"GetTex1DArrDimensions_2",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler1DArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,4);
    std::__cxx11::string::string((string *)&local_270,"GetTex1DArrDimensions_4",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler2D");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,2);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DDimensions_2",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler2D");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,4);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DDimensions_4",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler2DArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DArrDimensions_3",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"sampler2DArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,5);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DArrDimensions_5",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"samplerCube");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,2);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DDimensions_2",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"samplerCube");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,4);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DDimensions_4",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"samplerCubeArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DArrDimensions_3",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"samplerCubeArray");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,5);
    std::__cxx11::string::string((string *)&local_270,"GetTex2DArrDimensions_5",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    std::operator+(&Dim,local_308,"samplerBuffer");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &Dim,local_278);
    std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
    FunctionStubHashKey::FunctionStubHashKey
              ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,1);
    std::__cxx11::string::string((string *)&local_270,"GetTexBufferDimensions_1",&local_3b2);
    GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)Dimensions);
    GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
    std::__cxx11::string::~string((string *)&local_270);
    FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&Dim);
    bVar4 = std::operator==(local_278,"");
    if (bVar4) {
      std::operator+(&Dim,local_308,"sampler3D");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
      std::__cxx11::string::string((string *)&local_270,"GetTex3DDimensions_3",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"sampler3D");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,5);
      std::__cxx11::string::string((string *)&local_270,"GetTex3DDimensions_5",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"sampler2DMS");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
      std::__cxx11::string::string((string *)&local_270,"GetTex2DMSDimensions_3",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"sampler2DMSArray");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,4);
      std::__cxx11::string::string((string *)&local_270,"GetTex2DMSArrDimensions_4",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"image1D");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,1);
      std::__cxx11::string::string((string *)&local_270,"GetRWTex1DDimensions_1",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"image1DArray");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,2);
      std::__cxx11::string::string((string *)&local_270,"GetRWTex1DArrDimensions_2",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"image2D");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,2);
      std::__cxx11::string::string((string *)&local_270,"GetRWTex2DDimensions_2",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"image2DArray");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
      std::__cxx11::string::string((string *)&local_270,"GetRWTex2DArrDimensions_3",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"image3D");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,3);
      std::__cxx11::string::string((string *)&local_270,"GetRWTex3DDimensions_3",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+(&Dim,local_308,"imageBuffer");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370
                     ,&Dim,local_278);
      std::__cxx11::string::string((string *)&GLSLSampler,"GetDimensions",(allocator *)&local_250);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&local_348,(String *)&local_370,&GLSLSampler,1);
      std::__cxx11::string::string((string *)&local_270,"GetRWTexBufferDimensions_1",&local_3b2);
      GLSLStubInfo::GLSLStubInfo((GLSLStubInfo *)&Attrib,&local_270,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions,(FunctionStubHashKey *)&local_348,(GLSLStubInfo *)&Attrib);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)Dimensions);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            Dimensions);
      GLSLStubInfo::~GLSLStubInfo((GLSLStubInfo *)&Attrib);
      std::__cxx11::string::~string((string *)&local_270);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&local_348);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&Dim);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"image1D");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"image1DArray");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"image2D");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"image2DArray");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"image3D");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Dimensions
                     ,local_308,"imageBuffer");
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&Attrib,Dimensions[0]._M_dataplus._M_p,true);
      std::__detail::
      _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_230,(value_type *)&Attrib);
      HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
      std::__cxx11::string::~string((string *)Dimensions);
    }
    lVar6 = local_220 + 0x20;
  }
  std::__cxx11::string::string((string *)Dimensions,"1D",(allocator *)&Attrib);
  std::__cxx11::string::string((string *)(Dimensions + 1),"1DArray",(allocator *)&local_348);
  std::__cxx11::string::string((string *)(Dimensions + 2),"2D",(allocator *)&local_370);
  std::__cxx11::string::string((string *)(Dimensions + 3),"2DArray",(allocator *)&Dim);
  std::__cxx11::string::string((string *)(Dimensions + 4),"3D",(allocator *)&GLSLSampler);
  std::__cxx11::string::string((string *)(Dimensions + 5),"Cube",(allocator *)&local_270);
  std::__cxx11::string::string((string *)(Dimensions + 6),"CubeArray",(allocator *)&local_250);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7) {
    local_278 = pbVar5;
    std::__cxx11::string::string((string *)&Dim,(string *)(Dimensions + (long)pbVar5));
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x60)
      break;
      local_308 = pbVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Attrib,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&Prefixes[0]._M_dataplus._M_p + (long)&(pbVar5->_M_dataplus)._M_p),
                     "sampler");
      std::operator+(&GLSLSampler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Attrib,
                     &Dim);
      std::__cxx11::string::~string((string *)&Attrib);
      std::__cxx11::string::string((string *)&local_270,"Sample",&local_3b2);
      FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
      std::__cxx11::string::string((string *)&local_250,"Sample_2",&local_3b1);
      GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib,&local_370,&local_348);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            &Attrib);
      GLSLStubInfo::~GLSLStubInfo(&local_348);
      std::__cxx11::string::~string((string *)&local_250);
      FunctionStubHashKey::~FunctionStubHashKey(&local_370);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string((string *)&local_270,"SampleBias",&local_3b2);
      FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
      std::__cxx11::string::string((string *)&local_250,"SampleBias_3",&local_3b1);
      GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib,&local_370,&local_348);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            &Attrib);
      GLSLStubInfo::~GLSLStubInfo(&local_348);
      std::__cxx11::string::~string((string *)&local_250);
      FunctionStubHashKey::~FunctionStubHashKey(&local_370);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string((string *)&local_270,"SampleLevel",&local_3b2);
      FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
      std::__cxx11::string::string((string *)&local_250,"SampleLevel_3",&local_3b1);
      GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib,&local_370,&local_348);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            &Attrib);
      GLSLStubInfo::~GLSLStubInfo(&local_348);
      std::__cxx11::string::~string((string *)&local_250);
      FunctionStubHashKey::~FunctionStubHashKey(&local_370);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string((string *)&local_270,"SampleGrad",&local_3b2);
      FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,4);
      std::__cxx11::string::string((string *)&local_250,"SampleGrad_4",&local_3b1);
      GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib,&local_370,&local_348);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            &Attrib);
      GLSLStubInfo::~GLSLStubInfo(&local_348);
      std::__cxx11::string::~string((string *)&local_250);
      FunctionStubHashKey::~FunctionStubHashKey(&local_370);
      std::__cxx11::string::~string((string *)&local_270);
      bVar4 = std::operator!=(&Dim,"Cube");
      if (bVar4) {
        bVar4 = std::operator!=(&Dim,"CubeArray");
        if (bVar4) {
          std::__cxx11::string::string((string *)&local_270,"Sample",&local_3b2);
          FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
          std::__cxx11::string::string((string *)&local_250,"Sample_3",&local_3b1);
          GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                    ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib,&local_370,&local_348);
          std::
          _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                    ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_3b0,
                     (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib);
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                 *)&Attrib);
          GLSLStubInfo::~GLSLStubInfo(&local_348);
          std::__cxx11::string::~string((string *)&local_250);
          FunctionStubHashKey::~FunctionStubHashKey(&local_370);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::string((string *)&local_270,"SampleBias",&local_3b2);
          FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,4);
          std::__cxx11::string::string((string *)&local_250,"SampleBias_4",&local_3b1);
          GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                    ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib,&local_370,&local_348);
          std::
          _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                    ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_3b0,
                     (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib);
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                 *)&Attrib);
          GLSLStubInfo::~GLSLStubInfo(&local_348);
          std::__cxx11::string::~string((string *)&local_250);
          FunctionStubHashKey::~FunctionStubHashKey(&local_370);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::string((string *)&local_270,"SampleLevel",&local_3b2);
          FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,4);
          std::__cxx11::string::string((string *)&local_250,"SampleLevel_4",&local_3b1);
          GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                    ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib,&local_370,&local_348);
          std::
          _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                    ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_3b0,
                     (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib);
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                 *)&Attrib);
          GLSLStubInfo::~GLSLStubInfo(&local_348);
          std::__cxx11::string::~string((string *)&local_250);
          FunctionStubHashKey::~FunctionStubHashKey(&local_370);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::string((string *)&local_270,"SampleGrad",&local_3b2);
          FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,5);
          std::__cxx11::string::string((string *)&local_250,"SampleGrad_5",&local_3b1);
          GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                    ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib,&local_370,&local_348);
          std::
          _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                    ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_3b0,
                     (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                      *)&Attrib);
          std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
          ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                 *)&Attrib);
          GLSLStubInfo::~GLSLStubInfo(&local_348);
          std::__cxx11::string::~string((string *)&local_250);
          FunctionStubHashKey::~FunctionStubHashKey(&local_370);
          std::__cxx11::string::~string((string *)&local_270);
        }
      }
      bVar4 = std::operator!=(&Dim,"1D");
      if (bVar4) {
        bVar4 = std::operator!=(&Dim,"1DArray");
        if (bVar4) {
          bVar4 = std::operator!=(&Dim,"3D");
          if (bVar4) {
            std::__cxx11::string::string((string *)&local_270,"Gather",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
            std::__cxx11::string::string((string *)&local_250,"Gather_2",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"Gather",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
            std::__cxx11::string::string((string *)&local_250,"Gather_3",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherRed",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
            std::__cxx11::string::string((string *)&local_250,"GatherRed_2",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherRed",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
            std::__cxx11::string::string((string *)&local_250,"GatherRed_3",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherGreen",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
            std::__cxx11::string::string((string *)&local_250,"GatherGreen_2",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherGreen",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
            std::__cxx11::string::string((string *)&local_250,"GatherGreen_3",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherBlue",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
            std::__cxx11::string::string((string *)&local_250,"GatherBlue_2",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherBlue",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
            std::__cxx11::string::string((string *)&local_250,"GatherBlue_3",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherAlpha",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
            std::__cxx11::string::string((string *)&local_250,"GatherAlpha_2",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::string((string *)&local_270,"GatherAlpha",&local_3b2);
            FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
            std::__cxx11::string::string((string *)&local_250,"GatherAlpha_3",&local_3b1);
            GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::
            pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                      ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib,&local_370,&local_348);
            std::
            _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                      ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_3b0,
                       (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                        *)&Attrib);
            std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
            ::~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                     *)&Attrib);
            GLSLStubInfo::~GLSLStubInfo(&local_348);
            std::__cxx11::string::~string((string *)&local_250);
            FunctionStubHashKey::~FunctionStubHashKey(&local_370);
            std::__cxx11::string::~string((string *)&local_270);
          }
        }
      }
      std::__cxx11::string::string((string *)&local_270,"CalculateLevelOfDetail",&local_3b2);
      FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
      std::__cxx11::string::string((string *)&local_250,"CalculateLevelOfDetail_2",&local_3b1);
      GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"");
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
                ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib,&local_370,&local_348);
      std::
      _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
                ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_3b0,
                 (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                  *)&Attrib);
      std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
      ~pair((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
            &Attrib);
      GLSLStubInfo::~GLSLStubInfo(&local_348);
      std::__cxx11::string::~string((string *)&local_250);
      FunctionStubHashKey::~FunctionStubHashKey(&local_370);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&GLSLSampler);
      pbVar5 = local_308 + 1;
    }
    std::__cxx11::string::~string((string *)&Dim);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(local_278->_M_dataplus)._M_p + 1);
  }
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","GatherCmp",3);
  pHVar2 = local_3b0;
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","GatherCmp",4);
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","GatherCmp",3);
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","GatherCmp",4);
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"samplerCubeShadow","GatherCmp",3);
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"samplerCubeArrayShadow","GatherCmp",3);
  std::__cxx11::string::string((string *)&Dim,"GatherCmp_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x60) {
    local_308 = pbVar5;
    std::__cxx11::string::string
              ((string *)&Dim,
               (string *)((long)&Prefixes[0]._M_dataplus._M_p + (long)&(pbVar5->_M_dataplus)._M_p));
    std::operator+(&GLSLSampler,&Dim,"sampler1D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTex1D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler1DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTex1DArr_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DArr_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler3D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTex3D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DMS");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DMS_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DMSArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DMSArr_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler1D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex1D_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler1DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex1DArr_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2D_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DArr_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler3D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,2);
    std::__cxx11::string::string((string *)&local_250,"LoadTex3D_2",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DMS");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DMS_3",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"sampler2DMSArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,3);
    std::__cxx11::string::string((string *)&local_250,"LoadTex2DMSArr_3",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"samplerBuffer");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadTexBuffer_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"image1D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTex1D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"image1DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTex1DArr_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"image2D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTex2D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"image2DArray");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTex2DArr_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"image3D");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTex3D_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::operator+(&GLSLSampler,&Dim,"imageBuffer");
    std::__cxx11::string::string((string *)&local_270,"Load",&local_3b2);
    FunctionStubHashKey::FunctionStubHashKey(&local_370,&GLSLSampler,&local_270,1);
    std::__cxx11::string::string((string *)&local_250,"LoadRWTexBuffer_1",&local_3b1);
    GLSLStubInfo::GLSLStubInfo(&local_348,&local_250,"_SWIZZLE");
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
    pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib,&local_370,&local_348);
    std::
    _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
              ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3b0,
               (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
              ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>
                *)&Attrib);
    GLSLStubInfo::~GLSLStubInfo(&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    FunctionStubHashKey::~FunctionStubHashKey(&local_370);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&GLSLSampler);
    std::__cxx11::string::~string((string *)&Dim);
    pbVar5 = local_308 + 1;
  }
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DShadow","SampleCmp",3);
  this_00 = local_3a0;
  p_Var1 = local_3a8;
  pHVar2 = local_3b0;
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex1D_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DArrayShadow","SampleCmp",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex1DArr_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","SampleCmp",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex2D_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","SampleCmp",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex2DArr_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"samplerCubeShadow","SampleCmp",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTexCube_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"samplerCubeArrayShadow","SampleCmp",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTexCubeArr_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DShadow","SampleCmp",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex1D_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DArrayShadow","SampleCmp",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex1DArr_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","SampleCmp",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex2D_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","SampleCmp",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpTex2DArr_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DShadow","SampleCmpLevelZero",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex1D_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DArrayShadow","SampleCmpLevelZero",3)
  ;
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex1DArr_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","SampleCmpLevelZero",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex2D_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","SampleCmpLevelZero",3)
  ;
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex2DArr_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"samplerCubeShadow","SampleCmpLevelZero",3);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0TexCube_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey
            (&local_370,"samplerCubeArrayShadow","SampleCmpLevelZero",3);
  std::__cxx11::string::string
            ((string *)&Dim,"SampleCmpLevel0TexCubeArr_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DShadow","SampleCmpLevelZero",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex1D_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler1DArrayShadow","SampleCmpLevelZero",4)
  ;
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex1DArr_4",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DShadow","SampleCmpLevelZero",4);
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex2D_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"sampler2DArrayShadow","SampleCmpLevelZero",4)
  ;
  std::__cxx11::string::string((string *)&Dim,"SampleCmpLevel0Tex2DArr_4",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedAdd",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAddSharedVar_2",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedAdd",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAddSharedVar_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedAdd",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAddImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedAdd",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAddImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedAdd",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedAnd",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAndSharedVar_2",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedAnd",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAndSharedVar_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedAnd",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAndImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedAnd",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedAndImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedAnd",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedExchange",2);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedExchangeSharedVar_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedExchange",3);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedExchangeSharedVar_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedExchange",2);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedExchangeImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedExchange",3);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedExchangeImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedExchange",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedMax",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMaxSharedVar_2",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedMax",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMaxSharedVar_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedMax",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMaxImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedMax",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMaxImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedMax",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedMin",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMinSharedVar_2",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedMin",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMinSharedVar_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedMin",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMinImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedMin",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedMinImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedMin",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedOr",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedOrSharedVar_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedOr",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedOrSharedVar_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedOr",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedOrImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedOr",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedOrImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedOr",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedXor",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedXorSharedVar_2",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedXor",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedXorSharedVar_3",(allocator *)&GLSLSampler)
  ;
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedXor",2);
  std::__cxx11::string::string((string *)&Dim,"InterlockedXorImage_2",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedXor",3);
  std::__cxx11::string::string((string *)&Dim,"InterlockedXorImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedXor",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedCompareExchange",4);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedCompareExchangeSharedVar_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedCompareExchange",4);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedCompareExchangeImage_4",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedCompareExchange",false)
  ;
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"shared_var","InterlockedCompareStore",3);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedCompareStoreSharedVar_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  FunctionStubHashKey::FunctionStubHashKey(&local_370,"image","InterlockedCompareStore",3);
  std::__cxx11::string::string
            ((string *)&Dim,"InterlockedCompareStoreImage_3",(allocator *)&GLSLSampler);
  GLSLStubInfo::GLSLStubInfo(&local_348,&Dim,"");
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::
  pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_true>
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib,&local_370,&local_348);
  std::
  _Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<Diligent::FunctionStubHashKey,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>
            ((_Hashtable<Diligent::FunctionStubHashKey,std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,std::allocator<std::pair<Diligent::FunctionStubHashKey_const,Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::FunctionStubHashKey>,Diligent::FunctionStubHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)pHVar2,
             (pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  std::pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>::~pair
            ((pair<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo> *)
             &Attrib);
  GLSLStubInfo::~GLSLStubInfo(&local_348);
  std::__cxx11::string::~string((string *)&Dim);
  FunctionStubHashKey::~FunctionStubHashKey(&local_370);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&Attrib,"InterlockedCompareStore",false);
  std::__detail::
  _Insert<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert(this_00,(value_type *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_vertexid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_VERTEX_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_instanceid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_INSTANCE_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>
            ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems[0]._M_elems + 1));
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 2);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_primitiveid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_PRIMITIVE_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems[2]._M_elems + 1);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey
            ((HashMapStringKey *)&local_348,"sv_rendertargetarrayindex",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_LAYER";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_outputcontrolpointid",false)
  ;
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 3);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_INVOCATION_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_primitiveid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_PRIMITIVE_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems + 1);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_tessfactor",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SetGLTessLevelOuter";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_insidetessfactor",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SetGLTessLevelInner";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 4);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_tessfactor",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GetGLTessLevelOuter";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_insidetessfactor",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GetGLTessLevelInner";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_domainlocation",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_TESS_COORD";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_primitiveid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_PRIMITIVE_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_POSITION";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>
            ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems[4]._M_elems + 1));
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_position",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 1);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_FRAG_COORD";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_isfrontface",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_FRONT_FACING";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_coverage",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_SAMPLE_MASK_IN";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_depth",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_SET_GL_FRAG_DEPTH";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>
            ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems[1]._M_elems + 1));
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_dispatchthreadid",false);
  p_Var1 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 5);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_GLOBAL_INVOCATION_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  p_Var3 = local_228;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_groupid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_WORK_GROUP_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_groupthreadid",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (char *)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_LOCAL_INVOCATION_ID";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_348,"sv_groupindex",false);
  Attrib = local_348.Name._M_dataplus._M_p;
  sStack_2d8 = local_348.Name._M_string_length;
  local_348.Name._M_dataplus._M_p = (pointer)0x0;
  local_348.Name._M_string_length = 0;
  local_2d0 = "_GET_GL_LOCAL_INVOCATION_INDEX";
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Diligent::HashMapStringKey,char_const*>>(p_Var1);
  HashMapStringKey::Clear((HashMapStringKey *)&Attrib);
  HashMapStringKey::Clear((HashMapStringKey *)&local_348);
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
    Attrib = *(char **)((long)&DAT_003d2f70 + lVar6);
    std::
    _Hashtable<Diligent::HashMapStringKey,Diligent::HashMapStringKey,std::allocator<Diligent::HashMapStringKey>,std::__detail::_Identity,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<char_const*&>(p_Var3,(HashMapStringKey *)&Attrib);
  }
  lVar6 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&Dimensions[0]._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&Suffixes[0]._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&Prefixes[0]._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  return;
}

Assistant:

HLSL2GLSLConverterImpl::HLSL2GLSLConverterImpl()
{
    // Prepare texture function stubs
    //                          sampler  usampler  isampler sampler*Shadow
    const String Prefixes[] = {"", "u", "i", ""};
    const String Suffixes[] = {"", "", "", "Shadow"};
    for (size_t i = 0; i < _countof(Prefixes); ++i)
    {
        const auto& Pref = Prefixes[i];
        const auto& Suff = Suffixes[i];
        // GetDimensions() does not return anything, so swizzle should be empty
#define DEFINE_GET_DIM_STUB(Name, Obj, NumArgs) m_GLSLStubs.emplace(make_pair(FunctionStubHashKey(Pref + Obj + Suff, "GetDimensions", NumArgs), GLSLStubInfo(Name, "")))

        DEFINE_GET_DIM_STUB("GetTex1DDimensions_1", "sampler1D", 1); // GetDimensions( Width )
        DEFINE_GET_DIM_STUB("GetTex1DDimensions_3", "sampler1D", 3); // GetDimensions( Mip, Width, NumberOfMips )

        DEFINE_GET_DIM_STUB("GetTex1DArrDimensions_2", "sampler1DArray", 2); // GetDimensions( Width, ArrElems )
        DEFINE_GET_DIM_STUB("GetTex1DArrDimensions_4", "sampler1DArray", 4); // GetDimensions( Mip, Width, ArrElems, NumberOfMips )

        DEFINE_GET_DIM_STUB("GetTex2DDimensions_2", "sampler2D", 2); // GetDimensions( Width, Height )
        DEFINE_GET_DIM_STUB("GetTex2DDimensions_4", "sampler2D", 4); // GetDimensions( Mip, Width, Height, NumberOfMips );

        DEFINE_GET_DIM_STUB("GetTex2DArrDimensions_3", "sampler2DArray", 3); // GetDimensions( Width, Height, ArrElems )
        DEFINE_GET_DIM_STUB("GetTex2DArrDimensions_5", "sampler2DArray", 5); // GetDimensions( Mip, Width, Height, ArrElems, NumberOfMips )

        DEFINE_GET_DIM_STUB("GetTex2DDimensions_2", "samplerCube", 2); // GetDimensions( Width, Height )
        DEFINE_GET_DIM_STUB("GetTex2DDimensions_4", "samplerCube", 4); // GetDimensions( Mip, Width, Height, NumberOfMips )

        DEFINE_GET_DIM_STUB("GetTex2DArrDimensions_3", "samplerCubeArray", 3); // GetDimensions( Width, Height, ArrElems )
        DEFINE_GET_DIM_STUB("GetTex2DArrDimensions_5", "samplerCubeArray", 5); // GetDimensions( Mip, Width, Height, ArrElems, NumberOfMips )

        DEFINE_GET_DIM_STUB("GetTexBufferDimensions_1", "samplerBuffer", 1); // GetDimensions( Width )

        if (Suff == "")
        {
            // No shadow samplers for Tex3D, Tex2DMS and Tex2DMSArr
            DEFINE_GET_DIM_STUB("GetTex3DDimensions_3", "sampler3D", 3); // GetDimensions( Width, Height, Depth )
            DEFINE_GET_DIM_STUB("GetTex3DDimensions_5", "sampler3D", 5); // GetDimensions( Mip, Width, Height, Depth, NumberOfMips )


            // clang-format off
            DEFINE_GET_DIM_STUB("GetTex2DMSDimensions_3",    "sampler2DMS",      3); // GetDimensions( Width, Height, NumSamples )
            DEFINE_GET_DIM_STUB("GetTex2DMSArrDimensions_4", "sampler2DMSArray", 4); // GetDimensions( Width, Height, ArrElems, NumSamples )

            // Images
            DEFINE_GET_DIM_STUB("GetRWTex1DDimensions_1",     "image1D",      1); // GetDimensions( Width )
            DEFINE_GET_DIM_STUB("GetRWTex1DArrDimensions_2",  "image1DArray", 2); // GetDimensions( Width, ArrElems )
            DEFINE_GET_DIM_STUB("GetRWTex2DDimensions_2",     "image2D",      2); // GetDimensions( Width, Height )
            DEFINE_GET_DIM_STUB("GetRWTex2DArrDimensions_3",  "image2DArray", 3); // GetDimensions( Width, Height, ArrElems )
            DEFINE_GET_DIM_STUB("GetRWTex3DDimensions_3",     "image3D",      3); // GetDimensions( Width, Height, Depth )
            DEFINE_GET_DIM_STUB("GetRWTexBufferDimensions_1", "imageBuffer",  1); // GetDimensions( Width )
            // clang-format on

            m_ImageTypes.insert(HashMapStringKey(Pref + "image1D"));
            m_ImageTypes.insert(HashMapStringKey(Pref + "image1DArray"));
            m_ImageTypes.insert(HashMapStringKey(Pref + "image2D"));
            m_ImageTypes.insert(HashMapStringKey(Pref + "image2DArray"));
            m_ImageTypes.insert(HashMapStringKey(Pref + "image3D"));
            m_ImageTypes.insert(HashMapStringKey(Pref + "imageBuffer"));
        }
#undef DEFINE_GET_DIM_STUB
    }

    String Dimensions[] = {"1D", "1DArray", "2D", "2DArray", "3D", "Cube", "CubeArray"};
    for (size_t d = 0; d < _countof(Dimensions); ++d)
    {
        String Dim = Dimensions[d];
        for (int i = 0; i < 3; ++i)
        {
            auto GLSLSampler = Prefixes[i] + "sampler" + Dim;

            // Use default swizzle to return the same number of components as specified in the texture declaration
            // Converter will insert _SWIZZLEn, where n is the number of components, after the function stub.
            // Example:
            // Texture2D<float3> Tex2D;
            // ...
            // Tex2D.Sample(Tex2D_sampler, f2UV) -> Sample_2(Tex2D, Tex2D_sampler, f2UV)_SWIZZLE3
            const Char* Swizzle = "_SWIZZLE";

#define DEFINE_STUB(Name, Obj, Func, NumArgs) m_GLSLStubs.emplace(make_pair(FunctionStubHashKey(Obj, Func, NumArgs), GLSLStubInfo(Name, Swizzle)))

            // clang-format off
            DEFINE_STUB("Sample_2",      GLSLSampler, "Sample",      2); // Sample     ( Sampler, Location )
            DEFINE_STUB("SampleBias_3",  GLSLSampler, "SampleBias",  3); // SampleBias ( Sampler, Location, Bias )
            DEFINE_STUB("SampleLevel_3", GLSLSampler, "SampleLevel", 3); // SampleLevel( Sampler, Location, LOD )
            DEFINE_STUB("SampleGrad_4",  GLSLSampler, "SampleGrad",  4); // SampleGrad ( Sampler, Location, DDX, DDY )
            if (Dim != "Cube" && Dim != "CubeArray")
            {
                // No offset versions for cube & cube array
                DEFINE_STUB("Sample_3",      GLSLSampler, "Sample",      3); // Sample     ( Sampler, Location, Offset )
                DEFINE_STUB("SampleBias_4",  GLSLSampler, "SampleBias",  4); // SampleBias ( Sampler, Location, Bias, Offset )
                DEFINE_STUB("SampleLevel_4", GLSLSampler, "SampleLevel", 4); // SampleLevel( Sampler, Location, LOD, Offset )
                DEFINE_STUB("SampleGrad_5",  GLSLSampler, "SampleGrad",  5); // SampleGrad ( Sampler, Location, DDX, DDY, Offset )
            }
            // clang-format on
            if (Dim != "1D" && Dim != "1DArray" && Dim != "3D")
            {
                // Gather always returns float4 independent of the number of components, so no swizzling
                Swizzle = "";
                DEFINE_STUB("Gather_2", GLSLSampler, "Gather", 2);           // Gather( SamplerState, Location )
                DEFINE_STUB("Gather_3", GLSLSampler, "Gather", 3);           // Gather( SamplerState, Location, Offset )
                DEFINE_STUB("GatherRed_2", GLSLSampler, "GatherRed", 2);     // GatherRed( SamplerState, Location )
                DEFINE_STUB("GatherRed_3", GLSLSampler, "GatherRed", 3);     // GatherRed( SamplerState, Location, Offset )
                DEFINE_STUB("GatherGreen_2", GLSLSampler, "GatherGreen", 2); // GatherGreen( SamplerState, Location )
                DEFINE_STUB("GatherGreen_3", GLSLSampler, "GatherGreen", 3); // GatherGreen( SamplerState, Location, Offset )
                DEFINE_STUB("GatherBlue_2", GLSLSampler, "GatherBlue", 2);   // GatherBlue( SamplerState, Location )
                DEFINE_STUB("GatherBlue_3", GLSLSampler, "GatherBlue", 3);   // GatherBlue( SamplerState, Location, Offset )
                DEFINE_STUB("GatherAlpha_2", GLSLSampler, "GatherAlpha", 2); // GatherAlpha( SamplerState, Location )
                DEFINE_STUB("GatherAlpha_3", GLSLSampler, "GatherAlpha", 3); // GatherAlpha( SamplerState, Location, Offset )
            }

            Swizzle = "";
            DEFINE_STUB("CalculateLevelOfDetail_2", GLSLSampler, "CalculateLevelOfDetail", 2); // CalculateLevelOfDetail(Sampler, Location)
        }
    }

    // Gather always returns float4 independent of the number of components, so no swizzling
    const Char* Swizzle = "";
    DEFINE_STUB("GatherCmp_3", "sampler2DShadow", "GatherCmp", 3);        // GatherCmp( SmplerCmp, Location, CompareValue )
    DEFINE_STUB("GatherCmp_4", "sampler2DShadow", "GatherCmp", 4);        // GatherCmp( SmplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("GatherCmp_3", "sampler2DArrayShadow", "GatherCmp", 3);   // GatherCmp( SmplerCmp, Location, CompareValue )
    DEFINE_STUB("GatherCmp_4", "sampler2DArrayShadow", "GatherCmp", 4);   // GatherCmp( SmplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("GatherCmp_3", "samplerCubeShadow", "GatherCmp", 3);      // GatherCmp( SmplerCmp, Location, CompareValue )
    DEFINE_STUB("GatherCmp_3", "samplerCubeArrayShadow", "GatherCmp", 3); // GatherCmp( SmplerCmp, Location, CompareValue )

    // All load operations should return the same number of components as specified
    // in texture declaration, so use swizzling. Example:
    // Texture3D<int2> Tex3D;
    // ...
    // Tex3D.Load(i4Location) -> LoadTex3D_1(Tex3D, i4Location)_SWIZZLE2
    Swizzle = "_SWIZZLE";
    for (int i = 0; i < 3; ++i)
    {
        auto Pref = Prefixes[i];
        // clang-format off
        DEFINE_STUB("LoadTex1D_1",      Pref + "sampler1D",        "Load", 1); // Load( Location )
        DEFINE_STUB("LoadTex1DArr_1",   Pref + "sampler1DArray",   "Load", 1); // Load( Location )
        DEFINE_STUB("LoadTex2D_1",      Pref + "sampler2D",        "Load", 1); // Load( Location )
        DEFINE_STUB("LoadTex2DArr_1",   Pref + "sampler2DArray",   "Load", 1); // Load( Location )
        DEFINE_STUB("LoadTex3D_1",      Pref + "sampler3D",        "Load", 1); // Load( Location )
        DEFINE_STUB("LoadTex2DMS_2",    Pref + "sampler2DMS",      "Load", 2); // Load( Location, Sample )
        DEFINE_STUB("LoadTex2DMSArr_2", Pref + "sampler2DMSArray", "Load", 2); // Load( Location, Sample )

        DEFINE_STUB("LoadTex1D_2",      Pref + "sampler1D",       "Load", 2);  // Load( Location, Offset )
        DEFINE_STUB("LoadTex1DArr_2",   Pref + "sampler1DArray",  "Load", 2);  // Load( Location, Offset )
        DEFINE_STUB("LoadTex2D_2",      Pref + "sampler2D",       "Load", 2);  // Load( Location, Offset )
        DEFINE_STUB("LoadTex2DArr_2",   Pref + "sampler2DArray",  "Load", 2);  // Load( Location, Offset )
        DEFINE_STUB("LoadTex3D_2",      Pref + "sampler3D",       "Load", 2);  // Load( Location, Offset )
        DEFINE_STUB("LoadTex2DMS_3",    Pref + "sampler2DMS",     "Load", 3);  // Load( Location, Sample, Offset )
        DEFINE_STUB("LoadTex2DMSArr_3", Pref + "sampler2DMSArray", "Load", 3); // Load( Location, Sample, Offset )

        DEFINE_STUB("LoadTexBuffer_1", Pref + "samplerBuffer", "Load", 1); // Load( Location )

        DEFINE_STUB("LoadRWTex1D_1",     Pref + "image1D",      "Load", 1); // Load( Location )
        DEFINE_STUB("LoadRWTex1DArr_1",  Pref + "image1DArray", "Load", 1); // Load( Location )
        DEFINE_STUB("LoadRWTex2D_1",     Pref + "image2D",      "Load", 1); // Load( Location )
        DEFINE_STUB("LoadRWTex2DArr_1",  Pref + "image2DArray", "Load", 1); // Load( Location )
        DEFINE_STUB("LoadRWTex3D_1",     Pref + "image3D",      "Load", 1); // Load( Location )
        DEFINE_STUB("LoadRWTexBuffer_1", Pref + "imageBuffer",  "Load", 1); // Load( Location )
        // clang-format on
    }

    // SampleCmp() returns float independent of the number of components, so
    // use no swizzling
    Swizzle = "";

    DEFINE_STUB("SampleCmpTex1D_3", "sampler1DShadow", "SampleCmp", 3);             // SampleCmp( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpTex1DArr_3", "sampler1DArrayShadow", "SampleCmp", 3);     // SampleCmp( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpTex2D_3", "sampler2DShadow", "SampleCmp", 3);             // SampleCmp( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpTex2DArr_3", "sampler2DArrayShadow", "SampleCmp", 3);     // SampleCmp( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpTexCube_3", "samplerCubeShadow", "SampleCmp", 3);         // SampleCmp( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpTexCubeArr_3", "samplerCubeArrayShadow", "SampleCmp", 3); // SampleCmp( SamplerCmp, Location, CompareValue )

    DEFINE_STUB("SampleCmpTex1D_4", "sampler1DShadow", "SampleCmp", 4);         // SampleCmp( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpTex1DArr_4", "sampler1DArrayShadow", "SampleCmp", 4); // SampleCmp( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpTex2D_4", "sampler2DShadow", "SampleCmp", 4);         // SampleCmp( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpTex2DArr_4", "sampler2DArrayShadow", "SampleCmp", 4); // SampleCmp( SamplerCmp, Location, CompareValue, Offset )


    DEFINE_STUB("SampleCmpLevel0Tex1D_3", "sampler1DShadow", "SampleCmpLevelZero", 3);             // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpLevel0Tex1DArr_3", "sampler1DArrayShadow", "SampleCmpLevelZero", 3);     // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpLevel0Tex2D_3", "sampler2DShadow", "SampleCmpLevelZero", 3);             // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpLevel0Tex2DArr_3", "sampler2DArrayShadow", "SampleCmpLevelZero", 3);     // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpLevel0TexCube_3", "samplerCubeShadow", "SampleCmpLevelZero", 3);         // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )
    DEFINE_STUB("SampleCmpLevel0TexCubeArr_3", "samplerCubeArrayShadow", "SampleCmpLevelZero", 3); // SampleCmpLevelZero( SamplerCmp, Location, CompareValue )

    DEFINE_STUB("SampleCmpLevel0Tex1D_4", "sampler1DShadow", "SampleCmpLevelZero", 4);         // SampleCmpLevelZero( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpLevel0Tex1DArr_4", "sampler1DArrayShadow", "SampleCmpLevelZero", 4); // SampleCmpLevelZero( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpLevel0Tex2D_4", "sampler2DShadow", "SampleCmpLevelZero", 4);         // SampleCmpLevelZero( SamplerCmp, Location, CompareValue, Offset )
    DEFINE_STUB("SampleCmpLevel0Tex2DArr_4", "sampler2DArrayShadow", "SampleCmpLevelZero", 4); // SampleCmpLevelZero( SamplerCmp, Location, CompareValue, Offset )


    // InterlockedOp( dest, val )
    // InterlockedOp( dest, val, original_val )
#define DEFINE_ATOMIC_OP_STUBS(Op)                                                  \
    DEFINE_STUB("Interlocked" Op "SharedVar_2", "shared_var", "Interlocked" Op, 2); \
    DEFINE_STUB("Interlocked" Op "SharedVar_3", "shared_var", "Interlocked" Op, 3); \
    DEFINE_STUB("Interlocked" Op "Image_2", "image", "Interlocked" Op, 2);          \
    DEFINE_STUB("Interlocked" Op "Image_3", "image", "Interlocked" Op, 3);          \
    m_AtomicOperations.insert(HashMapStringKey("Interlocked" Op));


    DEFINE_ATOMIC_OP_STUBS("Add");
    DEFINE_ATOMIC_OP_STUBS("And");
    DEFINE_ATOMIC_OP_STUBS("Exchange");
    DEFINE_ATOMIC_OP_STUBS("Max");
    DEFINE_ATOMIC_OP_STUBS("Min");
    DEFINE_ATOMIC_OP_STUBS("Or");
    DEFINE_ATOMIC_OP_STUBS("Xor");

    // InterlockedCompareExchange( dest, compare_value, value, original_value )
    DEFINE_STUB("InterlockedCompareExchangeSharedVar_4", "shared_var", "InterlockedCompareExchange", 4);
    DEFINE_STUB("InterlockedCompareExchangeImage_4", "image", "InterlockedCompareExchange", 4);
    m_AtomicOperations.insert(HashMapStringKey("InterlockedCompareExchange"));

    // InterlockedCompareStore( dest, compare_value, value )
    DEFINE_STUB("InterlockedCompareStoreSharedVar_3", "shared_var", "InterlockedCompareStore", 3);
    DEFINE_STUB("InterlockedCompareStoreImage_3", "image", "InterlockedCompareStore", 3);
    m_AtomicOperations.insert(HashMapStringKey("InterlockedCompareStore"));

#undef DEFINE_STUB

#define DEFINE_VARIABLE(ShaderInd, IsOut, Semantic, Variable) m_HLSLSemanticToGLSLVar[ShaderInd][IsOut].emplace(make_pair(HashMapStringKey(Semantic), Variable))
    DEFINE_VARIABLE(VSInd, InVar, "sv_vertexid", "_GET_GL_VERTEX_ID");
    DEFINE_VARIABLE(VSInd, InVar, "sv_instanceid", "_GET_GL_INSTANCE_ID");
    DEFINE_VARIABLE(VSInd, OutVar, "sv_position", "_SET_GL_POSITION");

    DEFINE_VARIABLE(GSInd, InVar, "sv_position", "_GET_GL_POSITION");
    DEFINE_VARIABLE(GSInd, InVar, "sv_primitiveid", "_GET_GL_PRIMITIVE_ID");
    DEFINE_VARIABLE(GSInd, OutVar, "sv_position", "_SET_GL_POSITION");
    DEFINE_VARIABLE(GSInd, OutVar, "sv_rendertargetarrayindex", "_SET_GL_LAYER");

    DEFINE_VARIABLE(HSInd, InVar, "sv_outputcontrolpointid", "_GET_GL_INVOCATION_ID");
    DEFINE_VARIABLE(HSInd, InVar, "sv_primitiveid", "_GET_GL_PRIMITIVE_ID");
    DEFINE_VARIABLE(HSInd, InVar, "sv_position", "_GET_GL_POSITION");
    DEFINE_VARIABLE(HSInd, OutVar, "sv_position", "_SET_GL_POSITION");
    DEFINE_VARIABLE(HSInd, OutVar, "sv_tessfactor", "_SetGLTessLevelOuter");
    DEFINE_VARIABLE(HSInd, OutVar, "sv_insidetessfactor", "_SetGLTessLevelInner");

    DEFINE_VARIABLE(DSInd, InVar, "sv_position", "_GET_GL_POSITION");
    DEFINE_VARIABLE(DSInd, InVar, "sv_tessfactor", "_GetGLTessLevelOuter");
    DEFINE_VARIABLE(DSInd, InVar, "sv_insidetessfactor", "_GetGLTessLevelInner");
    DEFINE_VARIABLE(DSInd, InVar, "sv_domainlocation", "_GET_GL_TESS_COORD");
    DEFINE_VARIABLE(DSInd, InVar, "sv_primitiveid", "_GET_GL_PRIMITIVE_ID");
    DEFINE_VARIABLE(DSInd, OutVar, "sv_position", "_SET_GL_POSITION");

    DEFINE_VARIABLE(PSInd, InVar, "sv_position", "_GET_GL_FRAG_COORD");
    DEFINE_VARIABLE(PSInd, InVar, "sv_isfrontface", "_GET_GL_FRONT_FACING");
    DEFINE_VARIABLE(PSInd, InVar, "sv_coverage", "_GET_GL_SAMPLE_MASK_IN");
    DEFINE_VARIABLE(PSInd, OutVar, "sv_depth", "_SET_GL_FRAG_DEPTH");

    DEFINE_VARIABLE(CSInd, InVar, "sv_dispatchthreadid", "_GET_GL_GLOBAL_INVOCATION_ID");
    DEFINE_VARIABLE(CSInd, InVar, "sv_groupid", "_GET_GL_WORK_GROUP_ID");
    DEFINE_VARIABLE(CSInd, InVar, "sv_groupthreadid", "_GET_GL_LOCAL_INVOCATION_ID");
    DEFINE_VARIABLE(CSInd, InVar, "sv_groupindex", "_GET_GL_LOCAL_INVOCATION_INDEX");
#undef DEFINE_VARIABLE

    for (const char* Attrib : {"numthreads", "earlydepthstencil", "domain", "partitioning", "outputtopology",
                               "outputcontrolpoints", "patchconstantfunc", "maxvertexcount"})
    {
        m_SpecialShaderAttributes.emplace(Attrib);
    }
}